

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

void __thiscall wasm::TranslateToFuzzReader::setupTables(TranslateToFuzzReader *this)

{
  Random *pRVar1;
  long *plVar2;
  size_t sVar3;
  ElementSegment *pEVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  long *plVar7;
  long *plVar8;
  Const *pCVar9;
  size_t *psVar10;
  long *plVar11;
  long lVar12;
  Module *pMVar13;
  ulong uVar14;
  pointer ppEVar15;
  pointer ppEVar16;
  char *pcVar17;
  pointer ppEVar18;
  Name NVar19;
  string_view sVar20;
  IString IVar21;
  Literal local_58;
  pointer local_40;
  ElementSegment *local_38;
  __single_object table;
  
  pMVar13 = this->wasm;
  plVar8 = *(long **)(pMVar13 + 0xa8);
  plVar2 = *(long **)(pMVar13 + 0xb0);
  uVar14 = (long)plVar2 - (long)plVar8;
  if (0 < (long)uVar14 >> 5) {
    plVar11 = (long *)((uVar14 & 0xffffffffffffffe0) + (long)plVar8);
    lVar12 = ((long)uVar14 >> 5) + 1;
    plVar8 = plVar8 + 2;
    do {
      if (*(long *)(plVar8[-2] + 0x50) == 0x12) {
        plVar8 = plVar8 + -2;
        goto LAB_00125534;
      }
      if (*(long *)(plVar8[-1] + 0x50) == 0x12) {
        plVar8 = plVar8 + -1;
        goto LAB_00125534;
      }
      if (*(long *)(*plVar8 + 0x50) == 0x12) goto LAB_00125534;
      if (*(long *)(plVar8[1] + 0x50) == 0x12) {
        plVar8 = plVar8 + 1;
        goto LAB_00125534;
      }
      lVar12 = lVar12 + -1;
      plVar8 = plVar8 + 4;
    } while (1 < lVar12);
    uVar14 = (long)plVar2 - (long)plVar11;
    plVar8 = plVar11;
  }
  lVar12 = (long)uVar14 >> 3;
  if (lVar12 == 1) {
LAB_00125513:
    if (*(long *)(*plVar8 + 0x50) != 0x12) {
      plVar8 = plVar2;
    }
LAB_00125534:
    if (plVar8 == plVar2) goto LAB_00125541;
    psVar10 = (size_t *)*plVar8;
  }
  else {
    if (lVar12 == 2) {
LAB_00125505:
      if (*(long *)(*plVar8 + 0x50) != 0x12) {
        plVar8 = plVar8 + 1;
        goto LAB_00125513;
      }
      goto LAB_00125534;
    }
    if (lVar12 == 3) {
      if (*(long *)(*plVar8 + 0x50) != 0x12) {
        plVar8 = plVar8 + 1;
        goto LAB_00125505;
      }
      goto LAB_00125534;
    }
LAB_00125541:
    pRVar1 = &this->random;
    uVar5 = Random::upTo(pRVar1,10);
    ppEVar18 = (pointer)(ulong)uVar5;
    uVar5 = Random::upTo(pRVar1,2);
    ppEVar16 = (pointer)0xffffffffffffffff;
    if (uVar5 == 0) {
      uVar5 = Random::upTo(pRVar1,4);
      ppEVar16 = (pointer)((long)ppEVar18 + (ulong)uVar5);
    }
    pMVar13 = this->wasm;
    ppEVar15 = (pointer)0x2;
    local_40 = ppEVar18;
    if (((byte)pMVar13[0x179] & 8) != 0) {
      uVar5 = Random::upTo(pRVar1,2);
      ppEVar15 = (pointer)((ulong)(uVar5 == 0) + 2);
      pMVar13 = this->wasm;
    }
    NVar19.super_IString.str = (IString)wasm::IString::interned(0xd,"fuzzing_table",0);
    sVar20 = (string_view)Names::getValidTableName(pMVar13,NVar19);
    local_38 = (ElementSegment *)operator_new(0x58);
    *(undefined8 *)&(local_38->super_Named).hasExplicitName = 0;
    (local_38->table).super_IString.str._M_len = 0;
    (local_38->table).super_IString.str._M_str = (char *)0x0;
    local_38->offset = (Expression *)0x0;
    (local_38->type).id = 0;
    (local_38->super_Named).name.super_IString.str = sVar20;
    local_38[1].super_Named.name.super_IString.str._M_len = 0x12;
    (local_38->data).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = ppEVar15;
    (local_38->data).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
    _M_impl.super__Vector_impl_data._M_start = local_40;
    (local_38->data).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppEVar16;
    (local_38->super_Named).hasExplicitName = true;
    psVar10 = (size_t *)wasm::Module::addTable((unique_ptr *)this->wasm);
    if (local_38 != (ElementSegment *)0x0) {
      operator_delete(local_38,0x58);
    }
    pMVar13 = this->wasm;
  }
  pcVar17 = (char *)psVar10[1];
  (this->funcrefTableName).super_IString.str._M_len = *psVar10;
  (this->funcrefTableName).super_IString.str._M_str = pcVar17;
  plVar8 = *(long **)(pMVar13 + 0x60);
  plVar2 = *(long **)(pMVar13 + 0x68);
  uVar14 = (long)plVar2 - (long)plVar8;
  if (0 < (long)uVar14 >> 5) {
    plVar7 = (long *)((uVar14 & 0xffffffffffffffe0) + (long)plVar8);
    lVar12 = ((long)uVar14 >> 5) + 1;
    plVar11 = plVar8 + 2;
    do {
      if ((*(long *)(plVar11[-2] + 0x20) != 0) && (*(long *)(plVar11[-2] + 0x30) == 0x12)) {
        plVar11 = plVar11 + -2;
        goto LAB_0012575b;
      }
      if ((*(long *)(plVar11[-1] + 0x20) != 0) && (*(long *)(plVar11[-1] + 0x30) == 0x12)) {
        plVar11 = plVar11 + -1;
        goto LAB_0012575b;
      }
      if ((*(long *)(*plVar11 + 0x20) != 0) && (*(long *)(*plVar11 + 0x30) == 0x12))
      goto LAB_0012575b;
      if ((*(long *)(plVar11[1] + 0x20) != 0) && (*(long *)(plVar11[1] + 0x30) == 0x12)) {
        plVar11 = plVar11 + 1;
        goto LAB_0012575b;
      }
      lVar12 = lVar12 + -1;
      plVar11 = plVar11 + 4;
    } while (1 < lVar12);
    uVar14 = (long)plVar2 - (long)plVar7;
    plVar8 = plVar7;
  }
  lVar12 = (long)uVar14 >> 3;
  if (lVar12 == 1) {
LAB_0012572f:
    plVar11 = plVar2;
    if ((*(long *)(*plVar8 + 0x20) != 0) && (plVar11 = plVar8, *(long *)(*plVar8 + 0x30) != 0x12)) {
      plVar11 = plVar2;
    }
  }
  else if (lVar12 == 2) {
LAB_00125715:
    if ((*(long *)(*plVar8 + 0x20) == 0) || (plVar11 = plVar8, *(long *)(*plVar8 + 0x30) != 0x12)) {
      plVar8 = plVar8 + 1;
      goto LAB_0012572f;
    }
  }
  else {
    plVar11 = plVar2;
    if ((lVar12 == 3) &&
       ((*(long *)(*plVar8 + 0x20) == 0 || (plVar11 = plVar8, *(long *)(*plVar8 + 0x30) != 0x12))))
    {
      plVar8 = plVar8 + 1;
      goto LAB_00125715;
    }
  }
LAB_0012575b:
  NVar19.super_IString.str._M_str = (char *)(this->funcrefTableName).super_IString.str._M_len;
  NVar19.super_IString.str._M_len = (size_t)pMVar13;
  lVar12 = wasm::Module::getTable(NVar19);
  if (plVar11 == plVar2) {
    Literal::makeFromInt32(&local_58,0,(Type)*(uintptr_t *)(lVar12 + 0x48));
    pCVar9 = Builder::makeConst(&this->builder,&local_58);
    local_38 = (ElementSegment *)operator_new(0x50);
    sVar3 = *psVar10;
    pcVar17 = (char *)psVar10[1];
    (local_38->super_Named).name.super_IString.str._M_len = 0;
    (local_38->super_Named).name.super_IString.str._M_str = (char *)0x0;
    (local_38->super_Named).hasExplicitName = false;
    (local_38->table).super_IString.str._M_len = sVar3;
    (local_38->table).super_IString.str._M_str = pcVar17;
    local_38->offset = (Expression *)pCVar9;
    (local_38->type).id = 0x12;
    (local_38->data).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_38->data).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_38->data).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    wasm::Literal::~Literal(&local_58);
    pEVar4 = local_38;
    pMVar13 = this->wasm;
    NVar19.super_IString.str = (IString)wasm::IString::interned(5,"elem$",0);
    sVar20 = (string_view)Names::getValidElementSegmentName(pMVar13,NVar19);
    (pEVar4->super_Named).name.super_IString.str = sVar20;
    (pEVar4->super_Named).hasExplicitName = false;
    wasm::Module::addElementSegment((unique_ptr *)this->wasm);
    if (local_38 != (ElementSegment *)0x0) {
      std::default_delete<wasm::ElementSegment>::operator()
                ((default_delete<wasm::ElementSegment> *)&local_38,local_38);
    }
  }
  pMVar13 = this->wasm;
  if (((byte)pMVar13[0x178] & 0x40) == 0) {
    return;
  }
  plVar8 = *(long **)(pMVar13 + 0xa8);
  plVar2 = *(long **)(pMVar13 + 0xb0);
  uVar14 = (long)plVar2 - (long)plVar8;
  if (0 < (long)uVar14 >> 5) {
    plVar11 = (long *)((uVar14 & 0xffffffffffffffe0) + (long)plVar8);
    lVar12 = ((long)uVar14 >> 5) + 1;
    plVar8 = plVar8 + 2;
    do {
      if (*(long *)(plVar8[-2] + 0x50) == 0x4a) {
        plVar8 = plVar8 + -2;
        goto LAB_001258fc;
      }
      if (*(long *)(plVar8[-1] + 0x50) == 0x4a) {
        plVar8 = plVar8 + -1;
        goto LAB_001258fc;
      }
      if (*(long *)(*plVar8 + 0x50) == 0x4a) goto LAB_001258fc;
      if (*(long *)(plVar8[1] + 0x50) == 0x4a) {
        plVar8 = plVar8 + 1;
        goto LAB_001258fc;
      }
      lVar12 = lVar12 + -1;
      plVar8 = plVar8 + 4;
    } while (1 < lVar12);
    uVar14 = (long)plVar2 - (long)plVar11;
    plVar8 = plVar11;
  }
  lVar12 = (long)uVar14 >> 3;
  if (lVar12 == 1) {
LAB_001258db:
    if (*(long *)(*plVar8 + 0x50) != 0x4a) {
      plVar8 = plVar2;
    }
  }
  else if (lVar12 == 2) {
LAB_001258cd:
    if (*(long *)(*plVar8 + 0x50) != 0x4a) {
      plVar8 = plVar8 + 1;
      goto LAB_001258db;
    }
  }
  else {
    if (lVar12 != 3) goto LAB_00125910;
    if (*(long *)(*plVar8 + 0x50) != 0x4a) {
      plVar8 = plVar8 + 1;
      goto LAB_001258cd;
    }
  }
LAB_001258fc:
  if (plVar8 != plVar2) {
    pcVar17 = (char *)((size_t *)*plVar8)[1];
    (this->exnrefTableName).super_IString.str._M_len = *(size_t *)*plVar8;
    (this->exnrefTableName).super_IString.str._M_str = pcVar17;
    return;
  }
LAB_00125910:
  pRVar1 = &this->random;
  uVar5 = Random::upTo(pRVar1,10);
  uVar6 = Random::upTo(pRVar1,2);
  pcVar17 = (char *)0xffffffffffffffff;
  if (uVar6 == 0) {
    uVar6 = Random::upTo(pRVar1,4);
    pcVar17 = (char *)(ulong)uVar5 + uVar6;
  }
  pMVar13 = this->wasm;
  NVar19.super_IString.str = (IString)wasm::IString::interned(0xc,"exnref_table",0);
  IVar21.str = (string_view)Names::getValidTableName(pMVar13,NVar19);
  local_38 = (ElementSegment *)operator_new(0x58);
  (((IString *)((long)local_38 + 0x10))->str)._M_len = 0;
  *(char **)((long)local_38 + 0x10U + 8) = (char *)0x0;
  (((IString *)((long)local_38 + 0x20))->str)._M_len = 0;
  *(char **)((long)local_38 + 0x20U + 8) = (char *)0x0;
  (((IString *)((long)local_38 + 0x30))->str)._M_len = 0;
  ((IString *)local_38)->str = IVar21.str;
  (((IString *)((long)local_38 + 0x50))->str)._M_len = 0x4a;
  *(char **)((long)local_38 + 0x40U + 8) = (char *)0x2;
  *(char **)((long)local_38 + 0x30U + 8) = (char *)(ulong)uVar5;
  *(char **)&((IString *)((long)local_38 + 0x40))->str = pcVar17;
  *(undefined1 *)&((IString *)((long)local_38 + 0x10))->str = 1;
  psVar10 = (size_t *)wasm::Module::addTable((unique_ptr *)this->wasm);
  pcVar17 = (char *)psVar10[1];
  (this->exnrefTableName).super_IString.str._M_len = *psVar10;
  (this->exnrefTableName).super_IString.str._M_str = pcVar17;
  if (local_38 != (ElementSegment *)0x0) {
    operator_delete(local_38,0x58);
  }
  return;
}

Assistant:

void TranslateToFuzzReader::setupTables() {
  // Ensure a funcref element segment and table exist. Segments with more
  // specific function types may have a smaller chance of getting functions.
  Table* table = nullptr;
  Type funcref = Type(HeapType::func, Nullable);
  auto iter = std::find_if(wasm.tables.begin(),
                           wasm.tables.end(),
                           [&](auto& table) { return table->type == funcref; });
  if (iter != wasm.tables.end()) {
    table = iter->get();
  } else {
    // Start from a potentially empty table.
    Address initial = upTo(10);
    // Make the max potentially higher, or unlimited.
    Address max;
    if (oneIn(2)) {
      max = initial + upTo(4);
    } else {
      max = Memory::kUnlimitedSize;
    }
    // Fuzz wasm64 when possible, sometimes.
    auto addressType = Type::i32;
    if (wasm.features.hasMemory64() && oneIn(2)) {
      addressType = Type::i64;
    }
    auto tablePtr =
      builder.makeTable(Names::getValidTableName(wasm, "fuzzing_table"),
                        funcref,
                        initial,
                        max,
                        addressType);
    tablePtr->hasExplicitName = true;
    table = wasm.addTable(std::move(tablePtr));
  }
  funcrefTableName = table->name;
  bool hasFuncrefElemSegment =
    std::any_of(wasm.elementSegments.begin(),
                wasm.elementSegments.end(),
                [&](auto& segment) {
                  return segment->table.is() && segment->type == funcref;
                });
  auto addressType = wasm.getTable(funcrefTableName)->addressType;
  if (!hasFuncrefElemSegment) {
    // TODO: use a random table
    auto segment = std::make_unique<ElementSegment>(
      table->name, builder.makeConst(Literal::makeFromInt32(0, addressType)));
    segment->setName(Names::getValidElementSegmentName(wasm, "elem$"), false);
    wasm.addElementSegment(std::move(segment));
  }

  // When EH is enabled, set up an exnref table.
  if (wasm.features.hasExceptionHandling()) {
    Type exnref = Type(HeapType::exn, Nullable);
    auto iter =
      std::find_if(wasm.tables.begin(), wasm.tables.end(), [&](auto& table) {
        return table->type == exnref;
      });
    if (iter != wasm.tables.end()) {
      // Use the existing one.
      exnrefTableName = iter->get()->name;
    } else {
      // Create a new exnref table.
      Address initial = upTo(10);
      Address max = oneIn(2) ? initial + upTo(4) : Memory::kUnlimitedSize;
      auto tablePtr =
        builder.makeTable(Names::getValidTableName(wasm, "exnref_table"),
                          exnref,
                          initial,
                          max,
                          Type::i32); // TODO: wasm64
      tablePtr->hasExplicitName = true;
      table = wasm.addTable(std::move(tablePtr));
      exnrefTableName = table->name;
    }
  }
}